

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightmapper.h
# Opt level: O0

void lmImageFtoUB(float *image,uchar *outImage,int w,int h,int c,float max)

{
  float fVar1;
  float local_34;
  int local_30;
  int i;
  float scale;
  float max_local;
  int c_local;
  int h_local;
  int w_local;
  uchar *outImage_local;
  float *image_local;
  
  if (c < 1) {
    __assert_fail("c > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                  ,0x6af,"void lmImageFtoUB(const float *, unsigned char *, int, int, int, float)");
  }
  local_34 = max;
  if ((max == 0.0) && (!NAN(max))) {
    local_34 = lmImageMax(image,w,h,c,0xf);
  }
  for (local_30 = 0; local_30 < w * h * c; local_30 = local_30 + 1) {
    fVar1 = lm_maxf(image[local_30] * (255.0 / local_34),0.0);
    fVar1 = lm_minf(fVar1,255.0);
    outImage[local_30] = (uchar)(int)fVar1;
  }
  return;
}

Assistant:

void lmImageFtoUB(const float *image, unsigned char *outImage, int w, int h, int c, float max)
{
	assert(c > 0);
	float scale = 255.0f / (max != 0.0f ? max : lmImageMax(image, w, h, c, LM_ALL_CHANNELS));
	for (int i = 0; i < w * h * c; i++)
		outImage[i] = (unsigned char)lm_minf(lm_maxf(image[i] * scale, 0.0f), 255.0f);
}